

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comb_filter.hpp
# Opt level: O2

void re::math::comb_filter<float,256l,128l>(span<const_float,_256L> in,span<float,_128L> out)

{
  pointer extraout_RDX;
  pointer peVar1;
  pointer extraout_RDX_00;
  long lVar2;
  extent_type<_1L> eVar3;
  float fVar4;
  span<const_float,__1L> input;
  
  comb_filter<float,128l,128l>((span<const_float,_128L>)in.storage_.data_,out);
  eVar3.size_ = (long)in.storage_.data_ + 4;
  peVar1 = extraout_RDX;
  for (lVar2 = 1; lVar2 != 0x80; lVar2 = lVar2 + 1) {
    input.storage_.data_ = peVar1;
    input.storage_.super_extent_type<_1L>.size_ = eVar3.size_;
    fVar4 = mean<float,_1l>((math *)0x3,input);
    *(float *)((long)out.storage_.data_ + lVar2 * 4) =
         fVar4 + *(float *)((long)out.storage_.data_ + lVar2 * 4);
    eVar3.size_ = eVar3.size_ + 8;
    peVar1 = extraout_RDX_00;
  }
  return;
}

Assistant:

void
comb_filter(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    static_assert(N_in >= 0 && N_out >= 0);
    static_assert(N_in % N_out == 0);

    constexpr auto n_new =  (N_in > N_out) ? N_in - N_out : 0;
    constexpr auto stage = N_in / N_out;

    if (stage > 1) {
        comb_filter(gsl::span<T const, n_new>(in.data(), n_new), out);
    } else {
        std::fill(std::begin(out), std::end(out), 0);
    }

    for (auto i = 1; i < N_out; ++i) {
        out[i] += mean(in.subspan(stage * (i - 1) + 1, 2*stage - 1));
    }
}